

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testHTML.c
# Opt level: O2

void startElementDebug(void *ctx,xmlChar *name,xmlChar **atts)

{
  xmlChar **ppxVar1;
  size_t sVar2;
  long lVar3;
  uchar *att;
  xmlChar *__s;
  int attlen;
  int outlen;
  long local_68;
  xmlChar **local_60;
  uchar output [40];
  
  fprintf(_stdout,"SAX.startElement(%s",name);
  if (atts != (xmlChar **)0x0) {
    lVar3 = 0;
    local_60 = atts;
    while (ppxVar1 = local_60, local_60[lVar3] != (xmlChar *)0x0) {
      local_68 = lVar3;
      fprintf(_stdout,", %s");
      __s = ppxVar1[local_68 + 1];
      if (__s != (xmlChar *)0x0) {
        fwrite("=\'",2,1,_stdout);
        while( true ) {
          sVar2 = strlen((char *)__s);
          attlen = (int)sVar2;
          if (attlen < 1) break;
          outlen = 0x27;
          htmlEncodeEntities(output,&outlen,__s,&attlen,0x27);
          output[outlen] = '\0';
          fputs((char *)output,_stdout);
          __s = __s + attlen;
        }
        fputc(0x27,_stdout);
      }
      lVar3 = local_68 + 2;
    }
  }
  fwrite(")\n",2,1,_stdout);
  return;
}

Assistant:

static void
startElementDebug(void *ctx ATTRIBUTE_UNUSED, const xmlChar *name, const xmlChar **atts)
{
    int i;

    fprintf(stdout, "SAX.startElement(%s", (char *) name);
    if (atts != NULL) {
        for (i = 0;(atts[i] != NULL);i++) {
	    fprintf(stdout, ", %s", atts[i++]);
	    if (atts[i] != NULL) {
		unsigned char output[40];
		const unsigned char *att = atts[i];
		int outlen, attlen;
	        fprintf(stdout, "='");
		while ((attlen = strlen((char*)att)) > 0) {
		    outlen = sizeof output - 1;
		    htmlEncodeEntities(output, &outlen, att, &attlen, '\'');
		    output[outlen] = 0;
		    fprintf(stdout, "%s", (char *) output);
		    att += attlen;
		}
		fprintf(stdout, "'");
	    }
	}
    }
    fprintf(stdout, ")\n");
}